

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

string * absl::CEscape_abi_cxx11_(string_view src)

{
  string *in_RDI;
  string *dest;
  Nonnull<std::string_*> in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  
  std::__cxx11::string::string((string *)in_RDI);
  anon_unknown_0::CEscapeAndAppendInternal((string_view)in_stack_000000a8,in_stack_000000a0);
  return in_RDI;
}

Assistant:

std::string CEscape(absl::string_view src) {
  std::string dest;
  CEscapeAndAppendInternal(src, &dest);
  return dest;
}